

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

void reportError(cmGeneratorExpressionContext *context,string *expr,string *result)

{
  ostream *poVar1;
  cmake *this;
  ostringstream e;
  string local_1b8;
  undefined1 local_198 [376];
  
  context->HadError = true;
  if (context->Quiet == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Error evaluating generator expression:\n",0x27);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"  ",2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(expr->_M_dataplus)._M_p,expr->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(result->_M_dataplus)._M_p,result->_M_string_length);
    this = cmLocalGenerator::GetCMakeInstance(context->LG);
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(this,FATAL_ERROR,&local_1b8,&context->Backtrace,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  }
  return;
}

Assistant:

void reportError(cmGeneratorExpressionContext *context,
                 const std::string &expr, const std::string &result)
{
  context->HadError = true;
  if (context->Quiet)
    {
    return;
    }

  std::ostringstream e;
  e << "Error evaluating generator expression:\n"
    << "  " << expr << "\n"
    << result;
  context->LG->GetCMakeInstance()
    ->IssueMessage(cmake::FATAL_ERROR, e.str(),
                    context->Backtrace);
}